

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  FILE *pFVar7;
  int c;
  LoadF lf;
  int local_2044;
  int local_2040 [2];
  FILE *local_2038;
  undefined1 local_2030 [8192];
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    pFVar7 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    piVar5 = __errno_location();
    *piVar5 = 0;
    local_2038 = fopen64(filename,"r");
    pFVar7 = local_2038;
    if (local_2038 == (FILE *)0x0) {
      pcVar6 = "open";
      goto LAB_001094e2;
    }
  }
  local_2040[0] = 0;
  local_2038 = pFVar7;
  iVar2 = skipcomment((FILE *)pFVar7,&local_2044);
  if (iVar2 != 0) {
    local_2040[0] = 1;
    local_2030[0] = 10;
  }
  uVar3 = (uint)(iVar2 != 0);
  if (local_2044 == 0x1b) {
    local_2040[0] = 0;
    if (filename != (char *)0x0) {
      piVar5 = __errno_location();
      *piVar5 = 0;
      local_2038 = freopen64(filename,"rb",pFVar7);
      if (local_2038 == (FILE *)0x0) {
        pcVar6 = "reopen";
        goto LAB_001094e2;
      }
      skipcomment((FILE *)local_2038,&local_2044);
      uVar3 = 0;
      goto LAB_0010945a;
    }
    uVar3 = 0;
    local_2044 = 0x1b;
LAB_00109468:
    local_2040[0] = uVar3 + 1;
    local_2030[uVar3] = (char)local_2044;
  }
  else {
LAB_0010945a:
    if (local_2044 != -1) goto LAB_00109468;
  }
  pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,local_2040,pcVar6,mode);
  pFVar7 = local_2038;
  iVar4 = ferror(local_2038);
  piVar5 = __errno_location();
  *piVar5 = 0;
  if (filename != (char *)0x0) {
    fclose(pFVar7);
  }
  if (iVar4 == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    return iVar2;
  }
  lua_settop(L,iVar1);
  pcVar6 = "read";
LAB_001094e2:
  errfile(L,pcVar6,iVar1);
  return 6;
}

Assistant:

LUALIB_API int luaL_loadfilex (lua_State *L, const char *filename,
                                             const char *mode) {
  LoadF lf;
  int status, readstatus;
  int c;
  int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
  if (filename == NULL) {
    lua_pushliteral(L, "=stdin");
    lf.f = stdin;
  }
  else {
    lua_pushfstring(L, "@%s", filename);
    errno = 0;
    lf.f = fopen(filename, "r");
    if (lf.f == NULL) return errfile(L, "open", fnameindex);
  }
  lf.n = 0;
  if (skipcomment(lf.f, &c))  /* read initial portion */
    lf.buff[lf.n++] = '\n';  /* add newline to correct line numbers */
  if (c == LUA_SIGNATURE[0]) {  /* binary file? */
    lf.n = 0;  /* remove possible newline */
    if (filename) {  /* "real" file? */
      errno = 0;
      lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
      if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
      skipcomment(lf.f, &c);  /* re-read initial portion */
    }
  }
  if (c != EOF)
    lf.buff[lf.n++] = cast_char(c);  /* 'c' is the first character */
  status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
  readstatus = ferror(lf.f);
  errno = 0;  /* no useful error number until here */
  if (filename) fclose(lf.f);  /* close file (even in case of errors) */
  if (readstatus) {
    lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
    return errfile(L, "read", fnameindex);
  }
  lua_remove(L, fnameindex);
  return status;
}